

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlParseComment(htmlParserCtxtPtr ctxt)

{
  uint uVar1;
  xmlParserInputState xVar2;
  commentSAXFunc p_Var3;
  ulong uVar4;
  uint val;
  uint uVar5;
  int iVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  xmlParserInputPtr pxVar9;
  uint uVar10;
  int iVar11;
  uint local_6c;
  int l;
  int rl;
  int local_60;
  int nl;
  ulong local_58;
  ulong local_50;
  int local_44;
  long local_40;
  long local_38;
  
  if (ctxt->token == 0) {
    pxVar9 = ctxt->input;
    pxVar7 = pxVar9->cur;
    if ((((*pxVar7 == '<') && (pxVar7[1] == '!')) && (pxVar7[2] == '-')) && (pxVar7[3] == '-')) {
      xVar2 = ctxt->instate;
      ctxt->instate = XML_PARSER_COMMENT;
      if ((500 < (long)pxVar7 - (long)pxVar9->base) && ((long)pxVar9->end - (long)pxVar7 < 500)) {
        xmlParserInputShrink(pxVar9);
        pxVar9 = ctxt->input;
        pxVar7 = pxVar9->cur;
      }
      pxVar9->cur = pxVar7 + 4;
      pxVar9->col = pxVar9->col + 4;
      pxVar7 = (xmlChar *)(*xmlMallocAtomic)(100);
      if (pxVar7 == (xmlChar *)0x0) {
        htmlErrMemory(ctxt,"buffer allocation failed\n");
      }
      else {
        *pxVar7 = '\0';
        val = htmlCurrentChar(ctxt,&local_44);
        if (val == 0) goto LAB_0014ac67;
        if (val != 0x3e) {
          pxVar9 = ctxt->input;
          pxVar8 = pxVar9->cur;
          if (*pxVar8 == '\n') {
            pxVar9->line = pxVar9->line + 1;
            pxVar9->col = 1;
          }
          else {
            pxVar9->col = pxVar9->col + 1;
          }
          ctxt->token = 0;
          local_50 = (ulong)local_44;
          pxVar9->cur = pxVar8 + local_50;
          local_6c = htmlCurrentChar(ctxt,&rl);
          if (local_6c == 0) {
LAB_0014ac67:
            htmlParseErr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment not terminated \n<!--%.50s\n",
                         pxVar7,(xmlChar *)0x0);
            (*xmlFree)(pxVar7);
            return;
          }
          if (local_6c != 0x3e || val != 0x2d) {
            pxVar9 = ctxt->input;
            pxVar8 = pxVar9->cur;
            if (*pxVar8 == '\n') {
              pxVar9->line = pxVar9->line + 1;
              pxVar9->col = 1;
            }
            else {
              pxVar9->col = pxVar9->col + 1;
            }
            ctxt->token = 0;
            local_58 = (ulong)rl;
            pxVar9->cur = pxVar8 + local_58;
            uVar5 = htmlCurrentChar(ctxt,&l);
            iVar11 = 0;
            local_60 = 100;
            iVar6 = l;
            uVar4 = local_58;
            while (local_58 = uVar4, l = iVar6, uVar10 = uVar5, uVar10 != 0) {
              if (((val == 0x2d) && (local_6c == 0x2d)) && (uVar10 == 0x3e)) goto LAB_0014a99b;
              pxVar9 = ctxt->input;
              pxVar8 = pxVar9->cur;
              if (*pxVar8 == '\n') {
                pxVar9->line = pxVar9->line + 1;
                pxVar9->col = 1;
              }
              else {
                pxVar9->col = pxVar9->col + 1;
              }
              ctxt->token = 0;
              local_40 = (long)l;
              pxVar9->cur = pxVar8 + local_40;
              local_38 = (long)iVar11;
              uVar5 = htmlCurrentChar(ctxt,&nl);
              if (uVar5 == 0) {
                pxVar9 = ctxt->input;
                if ((500 < (long)pxVar9->cur - (long)pxVar9->base) &&
                   ((long)pxVar9->end - (long)pxVar9->cur < 500)) {
                  xmlParserInputShrink(pxVar9);
                }
                if ((ctxt->progressive == 0) &&
                   (pxVar9 = ctxt->input, (long)pxVar9->end - (long)pxVar9->cur < 0xfa)) {
                  xmlParserInputGrow(pxVar9,0xfa);
                }
                uVar5 = htmlCurrentChar(ctxt,&nl);
              }
              if (uVar5 == 0x3e && (uVar10 == 0x21 && (local_6c == 0x2d && val == 0x2d))) {
                htmlParseErr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,
                             "Comment incorrectly closed by \'--!>\'",(xmlChar *)0x0,(xmlChar *)0x0)
                ;
                goto LAB_0014a99b;
              }
              pxVar8 = pxVar7;
              iVar6 = local_60;
              if (local_60 <= iVar11 + 5) {
                iVar6 = local_60 * 2;
                local_60 = iVar6;
                pxVar8 = (xmlChar *)(*xmlRealloc)(pxVar7,(long)iVar6);
                if (pxVar8 == (xmlChar *)0x0) {
                  (*xmlFree)(pxVar7);
                  htmlErrMemory(ctxt,"growing buffer failed\n");
                  ctxt->instate = xVar2;
                  return;
                }
              }
              pxVar7 = pxVar8;
              if ((int)val < 0x100) {
                if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
                goto LAB_0014aba6;
LAB_0014abfc:
                htmlParseErrInt(ctxt,0x1e37a2,(char *)(ulong)val,iVar6);
LAB_0014ac26:
                l = (int)local_40;
              }
              else {
                uVar1 = val - 0xe000;
                iVar6 = CONCAT31((int3)(uVar1 >> 8),uVar1 < 0x1ffe || val < 0xd800);
                if (0xfffff < val - 0x10000 && (uVar1 >= 0x1ffe && val >= 0xd800))
                goto LAB_0014abfc;
LAB_0014aba6:
                if ((int)local_50 != 1) {
                  iVar6 = xmlCopyChar((int)local_50,pxVar7 + local_38,val);
                  iVar11 = iVar6 + iVar11;
                  goto LAB_0014ac26;
                }
                iVar11 = iVar11 + 1;
                pxVar7[local_38] = (xmlChar)val;
                local_58 = (ulong)(uint)rl;
              }
              val = local_6c;
              local_6c = uVar10;
              iVar6 = nl;
              rl = l;
              uVar4 = (ulong)(uint)l;
              local_50 = local_58;
            }
            pxVar7[iVar11] = '\0';
            goto LAB_0014ac67;
          }
        }
        iVar11 = 0;
        htmlParseErr(ctxt,XML_ERR_COMMENT_ABRUPTLY_ENDED,"Comment abruptly ended",(xmlChar *)0x0,
                     (xmlChar *)0x0);
LAB_0014a99b:
        pxVar7[iVar11] = '\0';
        xmlNextChar(ctxt);
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
            (p_Var3 = ctxt->sax->comment, p_Var3 != (commentSAXFunc)0x0)) && (ctxt->disableSAX == 0)
           ) {
          (*p_Var3)(ctxt->userData,pxVar7);
        }
        (*xmlFree)(pxVar7);
      }
      ctxt->instate = xVar2;
    }
  }
  return;
}

Assistant:

static void
htmlParseComment(htmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len;
    int size = HTML_PARSER_BUFFER_SIZE;
    int q, ql;
    int r, rl;
    int cur, l;
    int next, nl;
    xmlParserInputState state;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!') ||
        (NXT(2) != '-') || (NXT(3) != '-')) return;

    state = ctxt->instate;
    ctxt->instate = XML_PARSER_COMMENT;
    SHRINK;
    SKIP(4);
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
        htmlErrMemory(ctxt, "buffer allocation failed\n");
	ctxt->instate = state;
	return;
    }
    len = 0;
    buf[len] = 0;
    q = CUR_CHAR(ql);
    if (q == 0)
        goto unfinished;
    if (q == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto unfinished;
    if (q == '-' && r == '>') {
        htmlParseErr(ctxt, XML_ERR_COMMENT_ABRUPTLY_ENDED, "Comment abruptly ended", NULL, NULL);
        cur = '>';
        goto finished;
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    while ((cur != 0) &&
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	NEXTL(l);
	next = CUR_CHAR(nl);
	if (next == 0) {
	    SHRINK;
	    GROW;
	    next = CUR_CHAR(nl);
	}

	if ((q == '-') && (r == '-') && (cur == '!') && (next == '>')) {
	  htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		       "Comment incorrectly closed by '--!>'", NULL, NULL);
	  cur = '>';
	  break;
	}

	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
	        htmlErrMemory(ctxt, "growing buffer failed\n");
		ctxt->instate = state;
		return;
	    }
	    buf = tmp;
	}
        if (IS_CHAR(q)) {
	    COPY_BUF(ql,buf,len,q);
        } else {
            htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                            "Invalid char in comment 0x%X\n", q);
        }

	q = r;
	ql = rl;
	r = cur;
	rl = l;
	cur = next;
	l = nl;
    }
finished:
    buf[len] = 0;
    if (cur == '>') {
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
	xmlFree(buf);
	ctxt->instate = state;
	return;
    }

unfinished:
    htmlParseErr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
		 "Comment not terminated \n<!--%.50s\n", buf, NULL);
    xmlFree(buf);
}